

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_11,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  float scalar;
  Type in0;
  Mat4x2 local_80;
  Vector<float,_3> local_60;
  VecAccess<float,_4,_3> local_50;
  Matrix<float,_2,_4> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,11>
              (&local_80,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
  }
  else {
    tcu::Matrix<float,_2,_4>::Matrix(&local_80,(float *)sr::(anonymous_namespace)::s_constInMat4x2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    scalar = (evalCtx->coords).m_data[0];
  }
  else {
    scalar = -0.2;
  }
  tcu::operator/(&local_38,&local_80,scalar);
  local_60.m_data[2] = local_38.m_data.m_data[2].m_data[0] + local_38.m_data.m_data[2].m_data[1];
  local_60.m_data[0] =
       local_38.m_data.m_data[3].m_data[0] +
       local_38.m_data.m_data[0].m_data[0] + local_38.m_data.m_data[0].m_data[1];
  local_60.m_data[1] =
       local_38.m_data.m_data[3].m_data[1] +
       local_38.m_data.m_data[1].m_data[1] + local_38.m_data.m_data[1].m_data[0];
  local_50.m_vector = &evalCtx->color;
  local_50.m_index[0] = 0;
  local_50.m_index[1] = 1;
  local_50.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_50,&local_60);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}